

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void increase_comb_counter_in_groups
               (size_t *ix_arr,size_t st,size_t end,size_t split_ix,size_t n,double *counter,
               double exp_remainder)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t ix1;
  
  puVar1 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,ix_arr + end + 1);
  uVar2 = ((long)puVar1 - (long)(ix_arr + st) >> 3) + st;
  if (exp_remainder <= 1.0) {
    for (; uVar3 = uVar2, st < uVar2; st = st + 1) {
      for (; uVar3 <= end; uVar3 = uVar3 + 1) {
        lVar4 = ix_arr[st] * (n - split_ix);
        counter[(ix_arr[uVar3] - split_ix) + lVar4] =
             counter[(ix_arr[uVar3] - split_ix) + lVar4] + 1.0;
      }
    }
  }
  else {
    for (; uVar3 = uVar2, st < uVar2; st = st + 1) {
      for (; uVar3 <= end; uVar3 = uVar3 + 1) {
        lVar4 = ix_arr[st] * (n - split_ix);
        counter[(ix_arr[uVar3] - split_ix) + lVar4] =
             counter[(ix_arr[uVar3] - split_ix) + lVar4] + exp_remainder;
      }
    }
  }
  return;
}

Assistant:

void increase_comb_counter_in_groups(size_t ix_arr[], size_t st, size_t end, size_t split_ix, size_t n,
                                     double counter[], double exp_remainder)
{
    size_t *ptr_split_ix = std::lower_bound(ix_arr + st, ix_arr + end + 1, split_ix);
    size_t n_group = std::distance(ix_arr + st, ptr_split_ix);
    n = n - split_ix;

    if (exp_remainder <= 1)
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]++;
    else
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix] += exp_remainder;
}